

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O2

int knote_delete(filter *filt,knote *kn)

{
  byte *pbVar1;
  knote *pkVar2;
  knote **ppkVar3;
  int iVar4;
  knote query;
  
  if ((int)kn->kn_flags < 0) {
    return -1;
  }
  query.kev.ident = (kn->kev).ident;
  knote_index_RB_FIND(&filt->kf_index,&query);
  knote_index_RB_REMOVE(&filt->kf_index,kn);
  pkVar2 = (kn->kn_ready).le_next;
  ppkVar3 = (kn->kn_ready).le_prev;
  if (pkVar2 == (knote *)0x0) {
    if (ppkVar3 == (knote **)0x0) goto LAB_00103c08;
  }
  else {
    (pkVar2->kn_ready).le_prev = ppkVar3;
  }
  *ppkVar3 = pkVar2;
  (kn->kn_ready).le_next = (knote *)0x0;
  (kn->kn_ready).le_prev = (knote **)0x0;
LAB_00103c08:
  iVar4 = (*filt->kn_delete)(filt,kn);
  pbVar1 = (byte *)((long)&kn->kn_flags + 3);
  *pbVar1 = *pbVar1 | 0x80;
  knote_release(kn);
  return iVar4;
}

Assistant:

int
knote_delete(struct filter *filt, struct knote *kn)
{
    struct knote query;
    struct knote *tmp;
    int rv;

    dbg_printf("kn=%p - calling kn_delete", kn);
    if (kn->kn_flags & KNFL_KNOTE_DELETED) {
        dbg_printf("kn=%p - double deletion detected", kn);
        return (-1);
    }

    /*
     * Verify that the knote wasn't removed by another
     * thread before we acquired the knotelist lock.
     */
    query.kev.ident = kn->kev.ident;
    kqueue_mutex_assert(filt->kf_kqueue, MTX_LOCKED);
    tmp = RB_FIND(knote_index, &filt->kf_index, &query);
    if (tmp != kn)
        dbg_printf("kn=%p - conflicting entry in filter tree", kn);

    RB_REMOVE(knote_index, &filt->kf_index, kn);

    if (LIST_INSERTED(kn, kn_ready))
        LIST_REMOVE_ZERO(kn, kn_ready);

    rv = filt->kn_delete(filt, kn);
    dbg_printf("kn=%p - kn_delete rv=%i", kn, rv);

    kn->kn_flags |= KNFL_KNOTE_DELETED;
    knote_release(kn);

    return (rv);
}